

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O3

void __thiscall LTAircraft::CalcRoll(LTAircraft *this,double _prevHeading)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  FlightModel *pFVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  
  dVar6 = HeadingDiff(_prevHeading,(this->ppos)._head);
  dVar7 = currCycle.diffTime;
  dVar6 = currCycle.diffTime / (dVar6 / 360.0);
  if ((this->super_Aircraft).bOnGrnd == true) {
    pdVar1 = &(this->speed).currSpeed_m_s;
    if ((0.2 < *pdVar1 || *pdVar1 == 0.2) ||
       (iVar3 = std::__cxx11::string::compare((char *)this->pMdl), iVar3 != 0)) {
      dVar7 = 0.0;
    }
    else {
      dVar7 = 7.0;
    }
    (this->ppos)._roll = dVar7;
    if (NAN(dVar6)) {
      fVar5 = 0.0;
    }
    else {
      fVar5 = (float)(this->pMdl->TAXI_TURN_TIME / dVar6) * 30.0;
    }
    (this->super_Aircraft).v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start[1] = fVar5;
    return;
  }
  (this->super_Aircraft).v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 0.0;
  if (NAN(dVar6)) {
    dVar6 = (this->ppos)._roll;
    pFVar4 = this->pMdl;
  }
  else {
    pFVar4 = this->pMdl;
    if (pFVar4->MIN_FLIGHT_TURN_TIME <= ABS(dVar6)) {
      dVar6 = (pFVar4->MIN_FLIGHT_TURN_TIME * pFVar4->ROLL_MAX_BANK) / dVar6;
    }
    else {
      dVar6 = (double)((ulong)ABS(pFVar4->ROLL_MAX_BANK) | (ulong)dVar6 & 0x8000000000000000);
    }
  }
  dVar2 = (this->ppos)._roll;
  dVar7 = dVar7 * pFVar4->ROLL_RATE;
  if (dVar7 < ABS(dVar2 - dVar6)) {
    if (dVar6 < dVar2) {
      (this->ppos)._roll = dVar2 - dVar7;
      return;
    }
    (this->ppos)._roll = dVar7 + dVar2;
    return;
  }
  (this->ppos)._roll = dVar6;
  return;
}

Assistant:

void LTAircraft::CalcRoll (double _prevHeading)
{
    // How much of a turn did we do since last frame?
    const double partOfCircle = HeadingDiff(_prevHeading, ppos.heading()) / 360.0;
    const double timeFullCircle = currCycle.diffTime / partOfCircle;  // at current turn rate (if small then we turn _very_ fast!)

    // On the ground we should actually better be levelled, but we turn the nose wheel
    if (IsOnGrnd()) {
        // except...if we are a stopped glider ;-)
        if (GetSpeed_m_s() < 0.2 && pMdl->isGlider())
            ppos.roll() = MDL_GLIDER_STOP_ROLL;
        else
            ppos.roll() = 0.0;
        
        // Nose wheel steering: Hm...we would need to know a lot about the plane's
        // geometry to do that exactly right...so we just guess: 30° for a standard turn:
        SetNoseWheelAngle(std::isnan(timeFullCircle) ? 0.0f :
                          30.0f * float(pMdl->TAXI_TURN_TIME / timeFullCircle));
        return;
    }
    
    // In the air we make sure nose wheel looks straight
    SetNoseWheelAngle(0.0f);
    
    // For the roll we assume that max bank angle is applied for the tightest turn.
    // If we are turning more slowly then we apply less bank angle.
    const double newRoll = (std::isnan(timeFullCircle) ? ppos.roll() :
                            std::abs(timeFullCircle) < pMdl->MIN_FLIGHT_TURN_TIME ? std::copysign(pMdl->ROLL_MAX_BANK,timeFullCircle) :
                            pMdl->ROLL_MAX_BANK * pMdl->MIN_FLIGHT_TURN_TIME / timeFullCircle);
    // safeguard against to harsh roll rates:
    if (std::abs(ppos.roll()-newRoll) > currCycle.diffTime * pMdl->ROLL_RATE) {
        if (newRoll < ppos.roll()) ppos.roll() -= currCycle.diffTime * pMdl->ROLL_RATE;
        else                       ppos.roll() += currCycle.diffTime * pMdl->ROLL_RATE;
    }
    else
        ppos.roll() = newRoll;
}